

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

NodeBase ** __thiscall
google::protobuf::internal::UntypedMapBase::CreateEmptyTable(UntypedMapBase *this,map_index_t n)

{
  uint uVar1;
  void *__s;
  NodeBase **ppNVar2;
  Nonnull<const_char_*> pcVar3;
  ulong v1;
  
  v1 = (ulong)n;
  if (n < 2) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (v1,2,"n >= kMinTableSize");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    uVar1 = n - 1 & n;
    if (uVar1 == 0) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)uVar1,0,"n & (n - 1) == 0u");
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      if (this->arena_ == (Arena *)0x0) {
        __s = operator_new(v1 * 8);
      }
      else {
        __s = Arena::AllocateForArray(this->arena_,v1 * 8);
      }
      ppNVar2 = (NodeBase **)memset(__s,0,v1 << 3);
      return ppNVar2;
    }
  }
  else {
    CreateEmptyTable();
  }
  CreateEmptyTable();
}

Assistant:

NodeBase** CreateEmptyTable(map_index_t n) {
    ABSL_DCHECK_GE(n, kMinTableSize);
    ABSL_DCHECK_EQ(n & (n - 1), 0u);
    NodeBase** result =
        arena_ == nullptr
            ? static_cast<NodeBase**>(::operator new(n * sizeof(NodeBase*)))
            : Arena::CreateArray<NodeBase*>(arena_, n);
    memset(result, 0, n * sizeof(result[0]));
    return result;
  }